

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# black_boxing.c
# Opt level: O1

_Bool check_arguments(int *series,size_t l,size_t n,size_t m,int *b,size_t *r,size_t *s,
                     inform_error *err)

{
  inform_error iVar1;
  ulong uVar2;
  long lVar3;
  size_t i;
  size_t sVar4;
  long lVar5;
  bool bVar6;
  _Bool _Var7;
  bool bVar8;
  double dVar9;
  double dVar10;
  
  if (series != (int *)0x0) {
    if (l == 0) {
      iVar1 = INFORM_ENOSOURCES;
      goto LAB_0015dbe0;
    }
    if (n == 0) {
      iVar1 = INFORM_ENOINITS;
      goto LAB_0015dbe0;
    }
    if (m == 0) {
      iVar1 = INFORM_ESHORTSERIES;
      goto LAB_0015dbe0;
    }
    if (b == (int *)0x0) {
      iVar1 = INFORM_EBASE;
      goto LAB_0015dbe0;
    }
    if (r != (size_t *)0x0) {
      bVar6 = true;
      uVar2 = 1;
      if (s == (size_t *)0x0) {
        do {
          if (r[uVar2 - 1] == 0) goto LAB_0015dbbc;
          if (m < r[uVar2 - 1]) goto LAB_0015dc4e;
          bVar6 = uVar2 < l;
          bVar8 = uVar2 != l;
          uVar2 = uVar2 + 1;
        } while (bVar8);
      }
      else {
        do {
          if ((r[uVar2 - 1] == 0) && (s[uVar2 - 1] == 0)) goto LAB_0015dbbc;
          if (m < r[uVar2 - 1] + s[uVar2 - 1]) goto LAB_0015dc4e;
          bVar6 = uVar2 < l;
          bVar8 = uVar2 != l;
          uVar2 = uVar2 + 1;
        } while (bVar8);
      }
      goto LAB_0015dc63;
    }
    dVar9 = 0.0;
    sVar4 = 0;
    do {
      if (b[sVar4] < 2) goto LAB_0015dd73;
      dVar10 = log2((double)b[sVar4]);
      dVar9 = dVar9 + dVar10;
      sVar4 = sVar4 + 1;
    } while (l != sVar4);
    goto LAB_0015dcea;
  }
  iVar1 = INFORM_ETIMESERIES;
LAB_0015dbe0:
  _Var7 = true;
  goto LAB_0015dbe2;
LAB_0015dbbc:
  iVar1 = INFORM_EKZERO;
  goto LAB_0015dc53;
LAB_0015dd73:
  iVar1 = INFORM_EBASE;
  goto LAB_0015dd78;
LAB_0015dc4e:
  iVar1 = INFORM_EKLONG;
LAB_0015dc53:
  if (err != (inform_error *)0x0) {
    *err = iVar1;
  }
  _Var7 = true;
  if (!bVar6) {
LAB_0015dc63:
    dVar9 = 0.0;
    lVar5 = 0;
    do {
      if (b[lVar5] < 2) goto LAB_0015dd73;
      sVar4 = r[lVar5];
      dVar10 = log2((double)b[lVar5]);
      dVar9 = dVar9 + dVar10 * (((double)CONCAT44(0x45300000,(int)(sVar4 >> 0x20)) -
                                1.9342813113834067e+25) +
                               ((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0));
      lVar5 = lVar5 + 1;
    } while (l + (l == 0) != lVar5);
LAB_0015dcea:
    if (s != (size_t *)0x0) {
      lVar5 = 0;
      do {
        sVar4 = s[lVar5];
        dVar10 = log2((double)b[lVar5]);
        dVar9 = dVar9 + dVar10 * (((double)CONCAT44(0x45300000,(int)(sVar4 >> 0x20)) -
                                  1.9342813113834067e+25) +
                                 ((double)CONCAT44(0x43300000,(int)sVar4) - 4503599627370496.0));
        lVar5 = lVar5 + 1;
      } while (l + (l == 0) != lVar5);
    }
    if (dVar9 <= 30.0) {
      lVar5 = m * n;
      _Var7 = true;
      uVar2 = 0;
      do {
        if (lVar5 != 0) {
          lVar3 = 0;
          do {
            if (series[lVar3] < 0) {
              iVar1 = INFORM_ENEGSTATE;
              goto LAB_0015dbe2;
            }
            if (b[uVar2] <= series[lVar3]) {
              iVar1 = INFORM_EBADSTATE;
              goto LAB_0015dbe2;
            }
            lVar3 = lVar3 + 1;
          } while (lVar5 - lVar3 != 0);
        }
        uVar2 = uVar2 + 1;
        _Var7 = uVar2 < l;
        series = series + lVar5;
      } while (uVar2 != l + (l == 0));
    }
    else {
      iVar1 = INFORM_EENCODE;
LAB_0015dd78:
      _Var7 = true;
LAB_0015dbe2:
      if (err != (inform_error *)0x0) {
        *err = iVar1;
      }
    }
  }
  return _Var7;
}

Assistant:

static bool check_arguments(int const *series, size_t l, size_t n, size_t m,
    int const *b, size_t const *r, size_t const *s, inform_error *err)
{

    if (series == NULL)
    {
        INFORM_ERROR_RETURN(err, INFORM_ETIMESERIES, true);
    }
    else if (l == 0)
    {
        INFORM_ERROR_RETURN(err, INFORM_ENOSOURCES, true);
    }
    else if (n == 0)
    {
        INFORM_ERROR_RETURN(err, INFORM_ENOINITS, true);
    }
    else if (m == 0)
    {
        INFORM_ERROR_RETURN(err, INFORM_ESHORTSERIES, true);
    }
    else if (b == NULL)
    {
        INFORM_ERROR_RETURN(err, INFORM_EBASE, true);
    }
    else if (r != NULL)
    {
        if (s != NULL)
        {
            for (size_t i = 0; i < l; ++i)
            {
                if (r[i] == 0 && s[i] == 0)
                    INFORM_ERROR_RETURN(err, INFORM_EKZERO, true);
                if (r[i] + s[i] > m)
                    INFORM_ERROR_RETURN(err, INFORM_EKLONG, true);
            }
        }
        else
        {
            for (size_t i = 0; i < l; ++i)
            {
                if (r[i] == 0)
                    INFORM_ERROR_RETURN(err, INFORM_EKZERO, true);
                if (r[i] > m)
                    INFORM_ERROR_RETURN(err, INFORM_EKLONG, true);
            }
        }
    }
    double bits = 0.0;
    if (r != NULL)
    {
        for (size_t i = 0; i < l; ++i)
        {
            if (b[i] < 2)
            {
                INFORM_ERROR_RETURN(err, INFORM_EBASE, true);
            }
            bits += r[i] * log2(b[i]);
        }
    }
    else
    {
        for (size_t i = 0; i < l; ++i)
        {
            if (b[i] < 2)
            {
                INFORM_ERROR_RETURN(err, INFORM_EBASE, true);
            }
            bits += log2(b[i]);
        }
    }
    if (s != NULL)
    {
        for (size_t i = 0; i < l; ++i)
        {
            bits += s[i] * log2(b[i]);
        }
    }
    if (bits > 30.0)
    {
        INFORM_ERROR_RETURN(err, INFORM_EENCODE, true);
    }
    for (size_t i = 0; i < l; ++i)
    {
        for (size_t j = 0; j < n * m; ++j)
        {
            if (series[n*m*i + j] < 0)
            {
                INFORM_ERROR_RETURN(err, INFORM_ENEGSTATE, true);
            }
            else if (series[n*m*i + j] >= b[i])
            {
                INFORM_ERROR_RETURN(err, INFORM_EBADSTATE, true);
            }
        }
    }

    return false;
}